

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgsequ.c
# Opt level: O2

void cgsequ(SuperMatrix *A,float *r,float *c,float *rowcnd,float *colcnd,float *amax,int *info)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  singlecomplex *psVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  int ii;
  
  *info = 0;
  if ((((A->nrow < 0) || (A->ncol < 0)) || (A->Stype != SLU_NC)) ||
     ((A->Dtype != SLU_C || (A->Mtype != SLU_GE)))) {
    *info = -1;
    ii = 1;
    input_error("cgsequ",&ii);
  }
  else if (A->nrow == 0 || A->ncol == 0) {
    *rowcnd = 1.0;
    *colcnd = 1.0;
    *amax = 0.0;
  }
  else {
    pvVar2 = A->Store;
    lVar3 = *(long *)((long)pvVar2 + 8);
    fVar12 = smach("S");
    uVar7 = 0;
    uVar4 = (ulong)(uint)A->nrow;
    if (A->nrow < 1) {
      uVar4 = uVar7;
    }
    for (; uVar4 != uVar7; uVar7 = uVar7 + 1) {
      r[uVar7] = 0.0;
    }
    lVar10 = 0;
    while( true ) {
      uVar1 = A->ncol;
      uVar4 = (ulong)(int)uVar1;
      if ((long)uVar4 <= lVar10) break;
      lVar5 = *(long *)((long)pvVar2 + 0x18);
      lVar9 = (long)*(int *)(lVar5 + lVar10 * 4);
      lVar10 = lVar10 + 1;
      psVar11 = (singlecomplex *)(lVar3 + lVar9 * 8);
      for (; lVar9 < *(int *)(lVar5 + lVar10 * 4); lVar9 = lVar9 + 1) {
        iVar6 = *(int *)(*(long *)((long)pvVar2 + 0x10) + lVar9 * 4);
        fVar13 = r[iVar6];
        dVar16 = c_abs1(psVar11);
        if ((double)fVar13 <= dVar16) {
          dVar16 = c_abs1(psVar11);
          fVar13 = (float)dVar16;
        }
        else {
          fVar13 = r[iVar6];
        }
        r[iVar6] = fVar13;
        lVar5 = *(long *)((long)pvVar2 + 0x18);
        psVar11 = psVar11 + 1;
      }
    }
    fVar13 = 1.0 / fVar12;
    uVar8 = 0;
    uVar7 = (ulong)(uint)A->nrow;
    if (A->nrow < 1) {
      uVar7 = uVar8;
    }
    fVar14 = 0.0;
    fVar15 = fVar13;
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      fVar17 = r[uVar8];
      if (fVar14 <= fVar17) {
        fVar14 = fVar17;
      }
      if (fVar17 <= fVar15) {
        fVar15 = fVar17;
      }
    }
    *amax = fVar14;
    uVar8 = 0;
    if ((fVar15 != 0.0) || (NAN(fVar15))) {
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        fVar17 = r[uVar8];
        if (r[uVar8] <= fVar12) {
          fVar17 = fVar12;
        }
        if (fVar13 <= fVar17) {
          fVar17 = fVar13;
        }
        r[uVar8] = 1.0 / fVar17;
      }
      if (fVar15 <= fVar12) {
        fVar15 = fVar12;
      }
      if (fVar13 <= fVar14) {
        fVar14 = fVar13;
      }
      *rowcnd = fVar15 / fVar14;
    }
    else {
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        if ((r[uVar8] == 0.0) && (!NAN(r[uVar8]))) {
          *info = (int)uVar8 + 1;
          return;
        }
      }
    }
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      c[uVar7] = 0.0;
    }
    lVar10 = 0;
    while (lVar10 < (int)uVar4) {
      lVar5 = *(long *)((long)pvVar2 + 0x18);
      lVar9 = (long)*(int *)(lVar5 + lVar10 * 4);
      psVar11 = (singlecomplex *)(lVar3 + lVar9 * 8);
      for (; lVar9 < *(int *)(lVar5 + (lVar10 + 1) * 4); lVar9 = lVar9 + 1) {
        iVar6 = *(int *)(*(long *)((long)pvVar2 + 0x10) + lVar9 * 4);
        fVar15 = c[lVar10];
        dVar16 = c_abs1(psVar11);
        if ((double)fVar15 <= (double)r[iVar6] * dVar16) {
          dVar16 = c_abs1(psVar11);
          fVar15 = (float)((double)r[iVar6] * dVar16);
        }
        else {
          fVar15 = c[lVar10];
        }
        c[lVar10] = fVar15;
        lVar5 = *(long *)((long)pvVar2 + 0x18);
        psVar11 = psVar11 + 1;
      }
      lVar10 = lVar10 + 1;
      uVar4 = (ulong)(uint)A->ncol;
    }
    uVar8 = 0;
    uVar7 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar7 = uVar8;
    }
    fVar15 = 0.0;
    fVar14 = fVar13;
    for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      fVar17 = c[uVar8];
      if (fVar15 <= fVar17) {
        fVar15 = fVar17;
      }
      if (fVar17 <= fVar14) {
        fVar14 = fVar17;
      }
    }
    if ((fVar14 != 0.0) || (NAN(fVar14))) {
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        fVar17 = c[uVar4];
        if (c[uVar4] <= fVar12) {
          fVar17 = fVar12;
        }
        if (fVar13 <= fVar17) {
          fVar17 = fVar13;
        }
        c[uVar4] = 1.0 / fVar17;
      }
      if (fVar14 <= fVar12) {
        fVar14 = fVar12;
      }
      if (fVar13 <= fVar15) {
        fVar15 = fVar13;
      }
      *colcnd = fVar14 / fVar15;
    }
    else {
      iVar6 = -1;
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        if ((c[uVar4] == 0.0) && (!NAN(c[uVar4]))) {
          *info = A->nrow - iVar6;
          return;
        }
        iVar6 = iVar6 + -1;
      }
    }
  }
  return;
}

Assistant:

void
cgsequ(SuperMatrix *A, float *r, float *c, float *rowcnd,
	float *colcnd, float *amax, int *info)
{


    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int_t i, j;
    int   irow;
    float rcmin, rcmax;
    float bignum, smlnum;
    extern float smach(char *);
    
    /* Test the input parameters. */
    *info = 0;
    if ( A->nrow < 0 || A->ncol < 0 ||
	 A->Stype != SLU_NC || A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -1;
    if (*info != 0) {
	int ii = -(*info);
	input_error("cgsequ", &ii);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || A->ncol == 0 ) {
	*rowcnd = 1.;
	*colcnd = 1.;
	*amax = 0.;
	return;
    }

    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Get machine constants. */
    smlnum = smach("S");  /* slamch_("S"); */
    bignum = 1. / smlnum;

    /* Compute row scale factors. */
    for (i = 0; i < A->nrow; ++i) r[i] = 0.;

    /* Find the maximum element in each row. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    r[irow] = SUPERLU_MAX( r[irow], c_abs1(&Aval[i]) );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (i = 0; i < A->nrow; ++i) {
	rcmax = SUPERLU_MAX(rcmax, r[i]);
	rcmin = SUPERLU_MIN(rcmin, r[i]);
    }
    *amax = rcmax;

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (i = 0; i < A->nrow; ++i)
	    if (r[i] == 0.) {
		*info = i + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (i = 0; i < A->nrow; ++i)
	    r[i] = 1. / SUPERLU_MIN( SUPERLU_MAX( r[i], smlnum ), bignum );
	/* Compute ROWCND = min(R(I)) / max(R(I)) */
	*rowcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    /* Compute column scale factors */
    for (j = 0; j < A->ncol; ++j) c[j] = 0.;

    /* Find the maximum element in each column, assuming the row
       scalings computed above. */
    for (j = 0; j < A->ncol; ++j)
	for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
	    irow = Astore->rowind[i];
	    c[j] = SUPERLU_MAX( c[j], c_abs1(&Aval[i]) * r[irow] );
	}

    /* Find the maximum and minimum scale factors. */
    rcmin = bignum;
    rcmax = 0.;
    for (j = 0; j < A->ncol; ++j) {
	rcmax = SUPERLU_MAX(rcmax, c[j]);
	rcmin = SUPERLU_MIN(rcmin, c[j]);
    }

    if (rcmin == 0.) {
	/* Find the first zero scale factor and return an error code. */
	for (j = 0; j < A->ncol; ++j)
	    if ( c[j] == 0. ) {
		*info = A->nrow + j + 1;
		return;
	    }
    } else {
	/* Invert the scale factors. */
	for (j = 0; j < A->ncol; ++j)
	    c[j] = 1. / SUPERLU_MIN( SUPERLU_MAX( c[j], smlnum ), bignum);
	/* Compute COLCND = min(C(J)) / max(C(J)) */
	*colcnd = SUPERLU_MAX( rcmin, smlnum ) / SUPERLU_MIN( rcmax, bignum );
    }

    return;

}